

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallExpression.cpp
# Opt level: O3

bool __thiscall
slang::ast::CallExpression::checkConstant
          (CallExpression *this,EvalContext *context,SubroutineSymbol *subroutine,SourceRange range)

{
  ushort uVar1;
  long lVar2;
  Diagnostic *this_00;
  Type *this_01;
  Type *pTVar3;
  long lVar4;
  DiagCode code;
  SourceRange range_00;
  SourceRange range_01;
  
  range_00.endLoc = range.startLoc;
  if ((*(byte *)((long)&(this->subroutine).
                        super__Variant_base<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                        .
                        super__Move_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                        .
                        super__Copy_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                        .
                        super__Move_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                        .
                        super__Copy_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                        .
                        super__Variant_storage_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                + 8) & 1) != 0) {
    return true;
  }
  if (*(int *)((context->stack).stackBase + 4) == 1) {
    code.subsystem = ConstEval;
    code.code = 0x1d;
  }
  else {
    uVar1 = *(ushort *)((context->stack).stackBase + 0xc);
    if ((char)uVar1 < '\0') {
      code.subsystem = ConstEval;
      code.code = 7;
    }
    else if ((uVar1 & 0xb) == 0) {
      if ((uVar1 & 0x270) != 0) {
        range_01.endLoc = range_00.endLoc;
        range_01.startLoc = (SourceLocation)subroutine;
        this_00 = EvalContext::addDiag((EvalContext *)this,(DiagCode)0x1b000c,range_01);
        Diagnostic::operator<<(this_00,*(string_view *)&(context->astCtx).lookupIndex);
        return false;
      }
      this_01 = DeclaredType::getType
                          ((DeclaredType *)
                           ((context->stack).super_SmallVectorBase<slang::ast::EvalContext::Frame>.
                            firstElement + 0x10));
      pTVar3 = this_01->canonical;
      if (pTVar3 == (Type *)0x0) {
        Type::resolveCanonical(this_01);
        pTVar3 = this_01->canonical;
      }
      if ((pTVar3->super_Symbol).kind == VoidType) {
        code.subsystem = ConstEval;
        code.code = 0x1f;
      }
      else {
        if (*(int *)(context->stack).super_SmallVectorBase<slang::ast::EvalContext::Frame>.
                    firstElement != 0) {
          Scope::elaborate((Scope *)&context->disableTarget);
        }
        lVar2 = *(long *)((context->stack).stackBase + 0x48);
        if (lVar2 != 0) {
          lVar4 = 0;
          do {
            if (*(int *)(*(long *)(*(long *)((context->stack).stackBase + 0x40) + lVar4) + 0x158) !=
                0) {
              code.subsystem = ConstEval;
              code.code = 0xc;
              goto LAB_00730efe;
            }
            lVar4 = lVar4 + 8;
          } while (lVar2 << 3 != lVar4);
        }
        if (*(int *)(((context->astCtx).firstTempVar)->super_VariableSymbol).super_ValueSymbol.
                    super_Symbol.name._M_len != 0x37) {
          return true;
        }
        code.subsystem = ConstEval;
        code.code = 0xe;
      }
    }
    else {
      code.subsystem = ConstEval;
      code.code = 0x12;
    }
  }
LAB_00730efe:
  range_00.startLoc = (SourceLocation)subroutine;
  EvalContext::addDiag((EvalContext *)this,code,range_00);
  return false;
}

Assistant:

bool CallExpression::checkConstant(EvalContext& context, const SubroutineSymbol& subroutine,
                                   SourceRange range) {
    if (context.flags.has(EvalFlags::IsScript))
        return true;

    if (subroutine.subroutineKind == SubroutineKind::Task) {
        context.addDiag(diag::ConstEvalTaskNotConstant, range);
        return false;
    }

    if (subroutine.flags.has(MethodFlags::DPIImport)) {
        context.addDiag(diag::ConstEvalDPINotConstant, range);
        return false;
    }

    if (subroutine.flags.has(MethodFlags::Virtual | MethodFlags::Pure | MethodFlags::Constructor)) {
        context.addDiag(diag::ConstEvalMethodNotConstant, range);
        return false;
    }

    if (subroutine.flags.has(MethodFlags::BuiltIn | MethodFlags::InterfaceExtern |
                             MethodFlags::ModportExport | MethodFlags::ModportImport)) {
        context.addDiag(diag::ConstEvalSubroutineNotConstant, range) << subroutine.name;
        return false;
    }

    if (subroutine.getReturnType().isVoid()) {
        context.addDiag(diag::ConstEvalVoidNotConstant, range);
        return false;
    }

    for (auto arg : subroutine.getArguments()) {
        if (arg->direction != ArgumentDirection::In) {
            context.addDiag(diag::ConstEvalFunctionArgDirection, range);
            return false;
        }
    }

    auto scope = subroutine.getParentScope();
    SLANG_ASSERT(scope);
    if (scope->asSymbol().kind == SymbolKind::GenerateBlock) {
        context.addDiag(diag::ConstEvalFunctionInsideGenerate, range);
        return false;
    }

    return true;
}